

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

int voceq(uchar *s1,uint l1,uchar *s2,uint l2)

{
  long lVar1;
  uint uVar2;
  
  if (l2 != 0 || l1 != 0) {
    if (l1 == 0 || l2 == 0) {
      return 0;
    }
    uVar2 = l1;
    if (l2 < l1) {
      uVar2 = l2;
    }
    if (l1 < 6) {
      uVar2 = l2;
    }
    if (uVar2 != l1) {
      return 0;
    }
    if (l1 != 0) {
      lVar1 = 0;
      do {
        if (s1[lVar1] != s2[lVar1]) {
          return 0;
        }
        lVar1 = lVar1 + 1;
      } while (l1 != (uint)lVar1);
    }
  }
  return 1;
}

Assistant:

static int voceq(uchar *s1, uint l1, uchar *s2, uint l2)
{
    uint i;

    if (l1 == 0 && l2 == 0)  return(TRUE);           /* both NULL - a match */
    if (l1 == 0 || l2 == 0)  return(FALSE);  /* one NULL only - not a match */
    if (l1 >= 6 && l2 >= l1) l2 = l1;
    if (l1 != l2)            return(FALSE);                /* ==> not equal */
    for (i = 0 ; i < l1 ; i++)
        if (*s1++ != *s2++)  return(FALSE);
    return(TRUE);                                          /* strings match */
}